

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_MinipointCounterTest_OwnWindPair_Test::TEST_MinipointCounterTest_OwnWindPair_Test
          (TEST_MinipointCounterTest_OwnWindPair_Test *this)

{
  WiningState *this_00;
  
  memset(this,0,0xc0);
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMinipointCounterTest_001dace0;
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).s;
  mahjong::WiningState::WiningState(this_00);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.melds.
  super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.pairs.
  super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.tiles.
  super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  mahjong::MinipointCounter::MinipointCounter
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,
             &(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h,this_00);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMinipointCounterTest_001da748;
  return;
}

Assistant:

TEST(MinipointCounterTest, OwnWindPair)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::SouthWind);
	addOpenNoPointsHandWithoutPair();
	s.winByDiscard();

	CHECK_EQUAL(22, m.total(false));
}